

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::anon_unknown_26::ANSIColourImpl::use(ANSIColourImpl *this,Code _colourCode)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  string local_48;
  ReusableStringStream local_28;
  SourceLineInfo local_18;
  
  iVar1 = (*((this->super_ColourImpl).m_stream)->_vptr_IStream[2])();
  poVar2 = (ostream *)CONCAT44(extraout_var,iVar1);
  switch(_colourCode) {
  case None:
  case Headers:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0m";
    lVar3 = 3;
    goto LAB_0016f5e5;
  case Red:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;31m";
    break;
  case Green:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;32m";
    break;
  case Blue:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;34m";
    break;
  case Cyan:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;36m";
    break;
  case Yellow:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;33m";
    break;
  case Grey:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[1;30m";
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_28);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_18.line = 0xd3e;
    operator<<(local_28.m_oss,&local_18);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.m_oss,"Unknown colour requested",0x18);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_48);
  case Bright:
    ReusableStringStream::ReusableStringStream(&local_28);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_18.line = 0xd3d;
    operator<<(local_28.m_oss,&local_18);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_28.m_oss,"not a colour",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_48);
  case BrightWhite:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[1;37m";
    break;
  case BrightRed:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[1;31m";
    break;
  case BrightGreen:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[1;32m";
    break;
  case BrightYellow:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[1;33m";
    break;
  case FileName:
    local_48._M_dataplus._M_p._0_1_ = 0x1b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
    pcVar4 = "[0;37m";
  }
  lVar3 = 6;
LAB_0016f5e5:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ostream::flush();
  return;
}

Assistant:

void use( Colour::Code _colourCode ) const override {
            auto setColour = [&out =
                                  m_stream->stream()]( char const* escapeCode ) {
                // The escape sequence must be flushed to console, otherwise
                // if stdin and stderr are intermixed, we'd get accidentally
                // coloured output.
                out << '\033' << escapeCode << std::flush;
            };
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }